

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O0

void __thiscall
clunk::Node::GetSliderCaptures(Node *this,Color color,MoveType type,uint64_t mvs,int from)

{
  int iVar1;
  int to_00;
  int iVar2;
  uint pc;
  int iVar3;
  bool bVar4;
  int cap;
  int dir;
  int to;
  int score;
  int pinDir;
  int from_local;
  uint64_t mvs_local;
  MoveType type_local;
  Color color_local;
  Node *this_local;
  
  if (this->checks != 0) {
    __assert_fail("!checks",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x6b2,
                  "void clunk::Node::GetSliderCaptures(const Color, const MoveType, uint64_t, const int)"
                 );
  }
  if ((from & 0xffffff88U) != 0) {
    __assert_fail("IS_SQUARE(from)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x6b3,
                  "void clunk::Node::GetSliderCaptures(const Color, const MoveType, uint64_t, const int)"
                 );
  }
  if ((undefined *)(&_board)[from] == _EMPTY) {
    __assert_fail("_board[from] != _EMPTY",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x6b4,
                  "void clunk::Node::GetSliderCaptures(const Color, const MoveType, uint64_t, const int)"
                 );
  }
  if ((uint)*(byte *)(&_board)[from] != (color | type)) {
    __assert_fail("_board[from]->type == (color|type)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x6b5,
                  "void clunk::Node::GetSliderCaptures(const Color, const MoveType, uint64_t, const int)"
                 );
  }
  if ((uint)*(byte *)((&_board)[from] + 1) != from) {
    __assert_fail("_board[from]->sqr == from",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x6b6,
                  "void clunk::Node::GetSliderCaptures(const Color, const MoveType, uint64_t, const int)"
                 );
  }
  iVar1 = GetPinDir(this,color,from);
  _pinDir = mvs;
  do {
    if (_pinDir == 0) {
      return;
    }
    if ((_pinDir & 0xff) != 0) {
      to_00 = ((uint)_pinDir & 0xff) - 1;
      iVar2 = Direction(from,to_00);
      if ((((iVar2 != -0x11 && iVar2 != -0xf) && iVar2 != 0xf) && iVar2 != 0x11) &&
          (((iVar2 != -0x10 && iVar2 != -1) && iVar2 != 1) && iVar2 != 0x10)) {
        __assert_fail("IS_DIR(dir)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x6bd,
                      "void clunk::Node::GetSliderCaptures(const Color, const MoveType, uint64_t, const int)"
                     );
      }
      if (iVar1 != 0) {
        if (iVar2 < 1) {
          iVar2 = -iVar2;
        }
        if (iVar2 != iVar1) goto LAB_00149e58;
      }
      pc = (uint)*(byte *)(&_board)[to_00];
      bVar4 = true;
      if (pc == 0) {
        bVar4 = (undefined *)(&_board)[to_00] == _EMPTY;
      }
      if (!bVar4) {
        __assert_fail("cap || (_board[to] == _EMPTY)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0x6c0,
                      "void clunk::Node::GetSliderCaptures(const Color, const MoveType, uint64_t, const int)"
                     );
      }
      if (pc != 0 && ((*(byte *)(&_board)[to_00] & 1) != 0) != color) {
        iVar2 = ValueOf(pc);
        iVar3 = Distance(from,to_00);
        AddMove(this,type,from,to_00,(iVar2 - iVar3) + type * -8,pc,0);
      }
    }
LAB_00149e58:
    _pinDir = _pinDir >> 8;
  } while( true );
}

Assistant:

void GetSliderCaptures(const Color color, const MoveType type,
                         uint64_t mvs, const int from)
  {
    assert(!checks);
    assert(IS_SQUARE(from));
    assert(_board[from] != _EMPTY);
    assert(_board[from]->type == (color|type));
    assert(_board[from]->sqr == from);
    const int pinDir = GetPinDir(color, from);
    int score;
    while (mvs) {
      if (mvs & 0xFF) {
        const int to = ((mvs & 0xFF) - 1);
        const int dir = (Direction(from, to));
        assert(IS_DIR(dir));
        if (!pinDir || (abs(dir) == pinDir)) {
          const int cap = _board[to]->type;
          assert(cap || (_board[to] == _EMPTY));
          if ((cap != 0) & (COLOR(cap) != color)) {
            score = (ValueOf(cap) - Distance(from, to) - (8 * type));
            AddMove(type, from, to, score, cap);
          }
        }
      }
      mvs >>= 8;
    }
  }